

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void M_ClearMenus(void)

{
  M_DemoNoPlay = false;
  if (DMenu::CurrentMenu != (DMenu *)0x0) {
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[4])();
    DMenu::CurrentMenu = (DMenu *)0x0;
  }
  V_SetBorderNeedRefresh();
  menuactive = MENU_Off;
  return;
}

Assistant:

void M_ClearMenus ()
{
	M_DemoNoPlay = false;
	if (DMenu::CurrentMenu != NULL)
	{
		DMenu::CurrentMenu->Destroy();
		DMenu::CurrentMenu = NULL;
	}
	V_SetBorderNeedRefresh();
	menuactive = MENU_Off;
}